

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen_interactive.cpp
# Opt level: O1

CapturedMouse __thiscall ftxui::ScreenInteractive::CaptureMouse(ScreenInteractive *this)

{
  undefined8 *puVar1;
  long in_RSI;
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  if (*(char *)(in_RSI + 0x9c) == '\x01') {
    (this->super_Screen).stencil.x_min = 0;
    (this->super_Screen).stencil.x_max = 0;
    puVar1 = (undefined8 *)0x0;
  }
  else {
    *(undefined1 *)(in_RSI + 0x9c) = 1;
    puVar1 = (undefined8 *)operator_new(0x28);
    local_38._8_8_ = 0;
    pcStack_20 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/build_O1/_deps/ftxui-src/src/ftxui/component/screen_interactive.cpp:274:7)>
                 ::_M_invoke;
    local_28 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/build_O1/_deps/ftxui-src/src/ftxui/component/screen_interactive.cpp:274:7)>
               ::_M_manager;
    *puVar1 = &PTR__CapturedMouseImpl_001759b8;
    std::function<void_()>::function
              ((function<void_()> *)(puVar1 + 1),(function<void_()> *)&local_38);
    if (local_28 != (code *)0x0) {
      (*local_28)(&local_38,&local_38,__destroy_functor);
    }
  }
  *(undefined8 **)&(this->super_Screen).stencil = puVar1;
  return (__uniq_ptr_data<ftxui::CapturedMouseInterface,_std::default_delete<ftxui::CapturedMouseInterface>,_true,_true>
          )(__uniq_ptr_data<ftxui::CapturedMouseInterface,_std::default_delete<ftxui::CapturedMouseInterface>,_true,_true>
            )this;
}

Assistant:

CapturedMouse ScreenInteractive::CaptureMouse() {
  if (mouse_captured)
    return nullptr;
  mouse_captured = true;
  return std::make_unique<CapturedMouseImpl>(
      [this] { mouse_captured = false; });
}